

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset_closure.cpp
# Opt level: O2

UnicodeSet * __thiscall icu_63::UnicodeSet::closeOver(UnicodeSet *this,int32_t attribute)

{
  UBool UVar1;
  UChar32 c;
  UChar32 UVar2;
  int32_t iVar3;
  BreakIterator *iter;
  UnicodeString *pUVar4;
  UnicodeString *pUVar5;
  int32_t j;
  int index;
  int iVar6;
  undefined4 length;
  UVector *this_00;
  undefined8 s;
  ulong uVar7;
  UChar32 cp;
  UChar *full;
  int local_1e8;
  UErrorCode status;
  ulong local_1e0;
  UnicodeString str;
  USetAdder local_198;
  UnicodeSet foldSet;
  Locale root;
  
  if (((this->stringSpan == (UnicodeSetStringSpan *)0x0 && this->bmpSet == (BMPSet *)0x0) &&
      ((attribute & 6U) != 0)) && ((this->fFlags & 1) == 0)) {
    UnicodeSet(&foldSet,this);
    str.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00471e80;
    str.fUnion.fStackFields.fLengthAndFlags = 2;
    local_198.add = _set_add;
    local_198.addRange = _set_addRange;
    local_198.addString = _set_addString;
    local_198.remove = (undefined1 *)0x0;
    local_198.removeRange = (undefined1 *)0x0;
    local_198.set = (USet *)&foldSet;
    if ((attribute & 2U) != 0) {
      UVector::removeAllElements(foldSet.strings);
    }
    local_1e8 = getRangeCount(this);
    uVar7 = 0;
    if (local_1e8 < 1) {
      local_1e8 = 0;
    }
    while (iVar6 = (int)uVar7, iVar6 != local_1e8) {
      c = getRangeStart(this,iVar6);
      local_1e0 = uVar7;
      UVar2 = getRangeEnd(this,iVar6);
      if ((attribute & 2U) == 0) {
        for (; c <= UVar2; c = c + 1) {
          iVar3 = ucase_toFullLower_63(c,(UCaseContextIterator *)0x0,(void *)0x0,&full,1);
          addCaseMapping(&foldSet,iVar3,full,&str);
          iVar3 = ucase_toFullTitle_63(c,(UCaseContextIterator *)0x0,(void *)0x0,&full,1);
          addCaseMapping(&foldSet,iVar3,full,&str);
          iVar3 = ucase_toFullUpper_63(c,(UCaseContextIterator *)0x0,(void *)0x0,&full,1);
          addCaseMapping(&foldSet,iVar3,full,&str);
          iVar3 = ucase_toFullFolding_63(c,&full,0);
          addCaseMapping(&foldSet,iVar3,full,&str);
        }
      }
      else {
        for (; c <= UVar2; c = c + 1) {
          ucase_addCaseClosure_63(c,&local_198);
        }
      }
      uVar7 = (ulong)((int)local_1e0 + 1);
    }
    this_00 = this->strings;
    if ((this_00 != (UVector *)0x0) && (iVar6 = this_00->count, 0 < iVar6)) {
      if ((attribute & 2U) == 0) {
        Locale::Locale(&root,"",(char *)0x0,(char *)0x0,(char *)0x0);
        status = U_ZERO_ERROR;
        iter = BreakIterator::createWordInstance(&root,&status);
        if (status < U_ILLEGAL_ARGUMENT_ERROR) {
          for (iVar6 = 0; iVar6 < this->strings->count; iVar6 = iVar6 + 1) {
            pUVar4 = (UnicodeString *)UVector::elementAt(this->strings,iVar6);
            pUVar5 = icu_63::UnicodeString::operator=(&str,pUVar4);
            icu_63::UnicodeString::toLower(pUVar5,&root);
            add(&foldSet,&str);
            pUVar5 = icu_63::UnicodeString::operator=(&str,pUVar4);
            icu_63::UnicodeString::toTitle(pUVar5,iter,&root);
            add(&foldSet,&str);
            pUVar5 = icu_63::UnicodeString::operator=(&str,pUVar4);
            icu_63::UnicodeString::toUpper(pUVar5,&root);
            add(&foldSet,&str);
            pUVar4 = icu_63::UnicodeString::operator=(&str,pUVar4);
            icu_63::UnicodeString::foldCase(pUVar4,0);
            add(&foldSet,&str);
          }
        }
        if (iter != (BreakIterator *)0x0) {
          (*(iter->super_UObject)._vptr_UObject[1])(iter);
        }
        Locale::~Locale(&root);
      }
      else {
        for (index = 0; index < iVar6; index = index + 1) {
          pUVar4 = (UnicodeString *)UVector::elementAt(this_00,index);
          icu_63::UnicodeString::operator=(&str,pUVar4);
          icu_63::UnicodeString::foldCase(&str,0);
          s = str.fUnion.fStackFields.fBuffer;
          if ((str.fUnion.fStackFields.fLengthAndFlags & 2U) == 0) {
            s = str.fUnion.fFields.fArray;
          }
          if ((str.fUnion.fStackFields.fLengthAndFlags & 0x11U) != 0) {
            s = (char16_t *)0x0;
          }
          length = str.fUnion.fFields.fLength;
          if (-1 < str.fUnion.fStackFields.fLengthAndFlags) {
            length = (int)str.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          UVar1 = ucase_addStringCaseClosure_63((UChar *)s,length,&local_198);
          if (UVar1 == '\0') {
            add(&foldSet,&str);
          }
          this_00 = this->strings;
          iVar6 = this_00->count;
        }
      }
    }
    operator=(this,&foldSet);
    icu_63::UnicodeString::~UnicodeString(&str);
    ~UnicodeSet(&foldSet);
  }
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::closeOver(int32_t attribute) {
    if (isFrozen() || isBogus()) {
        return *this;
    }
    if (attribute & (USET_CASE_INSENSITIVE | USET_ADD_CASE_MAPPINGS)) {
        {
            UnicodeSet foldSet(*this);
            UnicodeString str;
            USetAdder sa = {
                foldSet.toUSet(),
                _set_add,
                _set_addRange,
                _set_addString,
                NULL, // don't need remove()
                NULL // don't need removeRange()
            };

            // start with input set to guarantee inclusion
            // USET_CASE: remove strings because the strings will actually be reduced (folded);
            //            therefore, start with no strings and add only those needed
            if (attribute & USET_CASE_INSENSITIVE) {
                foldSet.strings->removeAllElements();
            }

            int32_t n = getRangeCount();
            UChar32 result;
            const UChar *full;

            for (int32_t i=0; i<n; ++i) {
                UChar32 start = getRangeStart(i);
                UChar32 end   = getRangeEnd(i);

                if (attribute & USET_CASE_INSENSITIVE) {
                    // full case closure
                    for (UChar32 cp=start; cp<=end; ++cp) {
                        ucase_addCaseClosure(cp, &sa);
                    }
                } else {
                    // add case mappings
                    // (does not add long s for regular s, or Kelvin for k, for example)
                    for (UChar32 cp=start; cp<=end; ++cp) {
                        result = ucase_toFullLower(cp, NULL, NULL, &full, UCASE_LOC_ROOT);
                        addCaseMapping(foldSet, result, full, str);

                        result = ucase_toFullTitle(cp, NULL, NULL, &full, UCASE_LOC_ROOT);
                        addCaseMapping(foldSet, result, full, str);

                        result = ucase_toFullUpper(cp, NULL, NULL, &full, UCASE_LOC_ROOT);
                        addCaseMapping(foldSet, result, full, str);

                        result = ucase_toFullFolding(cp, &full, 0);
                        addCaseMapping(foldSet, result, full, str);
                    }
                }
            }
            if (strings != NULL && strings->size() > 0) {
                if (attribute & USET_CASE_INSENSITIVE) {
                    for (int32_t j=0; j<strings->size(); ++j) {
                        str = *(const UnicodeString *) strings->elementAt(j);
                        str.foldCase();
                        if(!ucase_addStringCaseClosure(str.getBuffer(), str.length(), &sa)) {
                            foldSet.add(str); // does not map to code points: add the folded string itself
                        }
                    }
                } else {
                    Locale root("");
#if !UCONFIG_NO_BREAK_ITERATION
                    UErrorCode status = U_ZERO_ERROR;
                    BreakIterator *bi = BreakIterator::createWordInstance(root, status);
                    if (U_SUCCESS(status)) {
#endif
                        const UnicodeString *pStr;

                        for (int32_t j=0; j<strings->size(); ++j) {
                            pStr = (const UnicodeString *) strings->elementAt(j);
                            (str = *pStr).toLower(root);
                            foldSet.add(str);
#if !UCONFIG_NO_BREAK_ITERATION
                            (str = *pStr).toTitle(bi, root);
                            foldSet.add(str);
#endif
                            (str = *pStr).toUpper(root);
                            foldSet.add(str);
                            (str = *pStr).foldCase();
                            foldSet.add(str);
                        }
#if !UCONFIG_NO_BREAK_ITERATION
                    }
                    delete bi;
#endif
                }
            }
            *this = foldSet;
        }
    }
    return *this;
}